

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

shared_ptr<cxxopts::Value> cxxopts::value<double>(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cxxopts::Value> sVar2;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<cxxopts::values::standard_value<double>>();
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_Value = local_18;
  (in_RDI->super_enable_shared_from_this<cxxopts::Value>)._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cxxopts::Value>)
         sVar2.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
  value()
  {
    return std::make_shared<values::standard_value<T>>();
  }